

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

bool bssl::ssl_add_message_cbb(SSL *ssl,CBB *cbb)

{
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var1;
  bool bVar2;
  size_t extraout_RDX;
  Array<unsigned_char> AVar3;
  byte local_69;
  Array<unsigned_char> local_50 [2];
  undefined1 local_30 [8];
  Array<unsigned_char> msg;
  CBB *cbb_local;
  SSL *ssl_local;
  
  msg.size_ = (size_t)cbb;
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_30);
  bVar2 = (*ssl->method->finish_message)(ssl,(CBB *)msg.size_,(Array<unsigned_char> *)local_30);
  local_69 = 1;
  if (bVar2) {
    p_Var1 = ssl->method->add_message;
    Array<unsigned_char>::Array(local_50,(Array<unsigned_char> *)local_30);
    AVar3.size_ = extraout_RDX;
    AVar3.data_ = (uchar *)local_50;
    bVar2 = (*p_Var1)(ssl,AVar3);
    local_69 = bVar2 ^ 0xff;
    Array<unsigned_char>::~Array(local_50);
  }
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_30);
  return (local_69 & 1) == 0;
}

Assistant:

bool ssl_add_message_cbb(SSL *ssl, CBB *cbb) {
  Array<uint8_t> msg;
  if (!ssl->method->finish_message(ssl, cbb, &msg) ||
      !ssl->method->add_message(ssl, std::move(msg))) {
    return false;
  }

  return true;
}